

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.h
# Opt level: O2

void __thiscall
iDynTree::ArticulatedBodyAlgorithmInternalBuffers::ArticulatedBodyAlgorithmInternalBuffers
          (ArticulatedBodyAlgorithmInternalBuffers *this)

{
  DOFSpatialMotionArray::DOFSpatialMotionArray(&this->S,0);
  DOFSpatialForceArray::DOFSpatialForceArray(&this->U,0);
  JointDOFsDoubleArray::JointDOFsDoubleArray(&this->D,0);
  JointDOFsDoubleArray::JointDOFsDoubleArray(&this->u,0);
  LinkVelArray::LinkVelArray(&this->linksVel,0);
  LinkAccArray::LinkAccArray(&this->linksBiasAcceleration,0);
  LinkAccArray::LinkAccArray(&this->linksAccelerations,0);
  LinkArticulatedBodyInertias::LinkArticulatedBodyInertias(&this->linkABIs,0);
  LinkWrenches::LinkWrenches(&this->linksBiasWrench,0);
  return;
}

Assistant:

ArticulatedBodyAlgorithmInternalBuffers() {}